

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_voice.c
# Opt level: O0

void stream_read(void *source,void **vbuf,uint *samples,ALLEGRO_AUDIO_DEPTH buffer_depth,
                size_t dest_maxc)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  uint *in_RDX;
  ALLEGRO_AUDIO_STREAM *in_RSI;
  long in_RDI;
  ALLEGRO_AUDIO_STREAM *in_R8;
  int bytes;
  uint pos;
  uint len;
  ALLEGRO_AUDIO_STREAM *stream;
  uint local_38;
  
  uVar1 = *(uint *)(in_RDI + 0x8c);
  local_38 = *(uint *)(in_RDI + 0xbc);
  if ((*(byte *)(in_RDI + 0xa8) & 1) == 0) {
    (in_RSI->spl).es.__pad[0] = 0;
    (in_RSI->spl).es.__pad[1] = 0;
    *in_RDX = 0;
  }
  else {
    if (uVar1 < *in_RDX) {
      *in_RDX = uVar1;
    }
    if (local_38 < uVar1) {
      sVar2 = al_get_channel_count(*(ALLEGRO_CHANNEL_CONF *)(in_RDI + 0x84));
      sVar3 = al_get_audio_depth_size(*(ALLEGRO_AUDIO_DEPTH *)(in_RDI + 0x80));
      *(long *)(in_RSI->spl).es.__pad =
           **(long **)(in_RDI + 0x120) + (long)(int)(local_38 * (int)sVar2 * (int)sVar3);
      if (uVar1 < local_38 + *in_RDX) {
        *in_RDX = uVar1 - local_38;
      }
      local_38 = *in_RDX + local_38;
    }
    else {
      _al_kcm_refill_stream(in_R8);
      if (**(long **)(in_RDI + 0x120) == 0) {
        if ((*(byte *)(in_RDI + 0x130) & 1) != 0) {
          *(undefined1 *)(in_RDI + 0xa8) = 0;
        }
        (in_RSI->spl).es.__pad[0] = 0;
        (in_RSI->spl).es.__pad[1] = 0;
        *in_RDX = 0;
        return;
      }
      *(undefined8 *)(in_RSI->spl).es.__pad = **(undefined8 **)(in_RDI + 0x120);
      local_38 = *in_RDX;
      _al_kcm_emit_stream_events(in_RSI);
    }
    *(uint *)(in_RDI + 0xbc) = local_38;
  }
  return;
}

Assistant:

static void stream_read(void *source, void **vbuf, unsigned int *samples,
   ALLEGRO_AUDIO_DEPTH buffer_depth, size_t dest_maxc)
{
   ALLEGRO_AUDIO_STREAM *stream = (ALLEGRO_AUDIO_STREAM*)source;
   unsigned int len = stream->spl.spl_data.len;
   unsigned int pos = stream->spl.pos;

   if (!stream->spl.is_playing) {
      *vbuf = NULL;
      *samples = 0;
      return;
   }

   if (*samples > len)
      *samples = len;

   if (pos >= len) {
      /* XXX: Handle the case where we need to call _al_kcm_refill_stream
       * multiple times due to ludicrous playback speed. */
      _al_kcm_refill_stream(stream);
      if (!stream->pending_bufs[0]) {
         if (stream->is_draining) {
            stream->spl.is_playing = false;
         }
         *vbuf = NULL;
         *samples = 0;
         return;
      }
      *vbuf = stream->pending_bufs[0];
      pos = *samples;

      _al_kcm_emit_stream_events(stream);
   }
   else {
      int bytes = pos * al_get_channel_count(stream->spl.spl_data.chan_conf)
                      * al_get_audio_depth_size(stream->spl.spl_data.depth);
      *vbuf = ((char *)stream->pending_bufs[0]) + bytes;

      if (pos + *samples > len)
         *samples = len - pos;
      pos += *samples;
   }

   stream->spl.pos = pos;

   (void)dest_maxc;
   (void)buffer_depth;
}